

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGV.cpp
# Opt level: O2

void __thiscall CGV::visit(CGV *this,Write *node)

{
  CodeWriter *pCVar1;
  deque<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_> *pdVar2;
  string *__rhs;
  _Elt_pointer ppAVar3;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  _Map_pointer local_a8;
  _Elt_pointer local_a0;
  _Elt_pointer local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  pdVar2 = AST::ASTNode::getChildren(&node->super_ASTNode);
  ppAVar3 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  local_a0 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_a8 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
             super__Deque_impl_data._M_start._M_node;
  local_98 = (pdVar2->super__Deque_base<AST::ASTNode_*,_std::allocator<AST::ASTNode_*>_>)._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  while (ppAVar3 != local_98) {
    (**(*ppAVar3)->_vptr_ASTNode)(*ppAVar3,this);
    pCVar1 = this->writer;
    __rhs = Variable::getName_abi_cxx11_(this->currentVar);
    std::operator+(&local_90,"Writing variable ",__rhs);
    CodeWriter::comment(pCVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    pCVar1 = this->writer;
    std::__cxx11::string::string((string *)&local_90,"r1",(allocator *)&local_50);
    std::__cxx11::string::string((string *)&local_70,"r12",&local_ab);
    CodeWriter::loadWord(pCVar1,&local_90,-4,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pCVar1 = this->writer;
    std::__cxx11::string::string((string *)&local_90,"jl",&local_ab);
    std::__cxx11::string::string((string *)&local_70,"r15",&local_a9);
    std::__cxx11::string::string((string *)&local_50,"putint",&local_aa);
    CodeWriter::OP(pCVar1,&local_90,&local_70,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    pCVar1 = this->writer;
    std::__cxx11::string::string((string *)&local_90,"Printing new line",(allocator *)&local_70);
    CodeWriter::comment(pCVar1,&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    CodeWriter::endl(this->writer);
    ppAVar3 = ppAVar3 + 1;
    if (ppAVar3 == local_a0) {
      ppAVar3 = local_a8[1];
      local_a8 = local_a8 + 1;
      local_a0 = ppAVar3 + 0x40;
    }
  }
  return;
}

Assistant:

void CGV::visit(Write *node) {
    for (auto &child : node->getChildren()) {
        child->accept(*this);
        writer->comment("Writing variable " + currentVar->getName());
        writer->loadWord("r1", -4, "r12");
        writer->OP("jl", "r15", "putint");
        writer->comment("Printing new line");
        writer->endl();
    }
}